

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<bool>::Reset(Walker<bool> *this)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  LogMessage local_190;
  Walker<bool> *local_10;
  Walker<bool> *this_local;
  
  if ((this->stack_ !=
       (stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
        *)0x0) &&
     (local_10 = this,
     sVar1 = std::
             stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
             ::size(this->stack_), sVar1 != 0)) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0x93);
    poVar2 = LogMessage::stream(&local_190);
    std::operator<<(poVar2,"Stack not empty.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
    while (sVar1 = std::
                   stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
                   ::size(this->stack_), sVar1 != 0) {
      pvVar3 = std::
               stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
               ::top(this->stack_);
      if (pvVar3->child_args != (bool *)0x0) {
        operator_delete(pvVar3->child_args);
      }
      std::
      stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
      ::pop(this->stack_);
    }
  }
  return;
}

Assistant:

void Regexp::Walker<T>::Reset() {
  if (stack_ && stack_->size() > 0) {
    LOG(DFATAL) << "Stack not empty.";
    while (stack_->size() > 0) {
      delete stack_->top().child_args;
      stack_->pop();
    }
  }
}